

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

XML_Error externalParEntProcessor(XML_Parser parser,char *s,char *end,char **nextPtr)

{
  XML_Bool XVar1;
  int local_3c;
  char *pcStack_38;
  int tok;
  char *next;
  char **nextPtr_local;
  char *end_local;
  char *s_local;
  XML_Parser parser_local;
  
  pcStack_38 = s;
  next = (char *)nextPtr;
  nextPtr_local = (char **)end;
  end_local = s;
  s_local = (char *)parser;
  local_3c = (*parser->m_encoding->scanners[0])(parser->m_encoding,s,end,&stack0xffffffffffffffc8);
  if (local_3c < 1) {
    if ((s_local[0x39c] == '\0') && (local_3c != 0)) {
      *(char **)next = end_local;
      return XML_ERROR_NONE;
    }
    switch(local_3c) {
    case 0:
      parser_local._4_4_ = XML_ERROR_INVALID_TOKEN;
      break;
    case -4:
    default:
      goto LAB_001bd159;
    case -2:
      parser_local._4_4_ = XML_ERROR_PARTIAL_CHAR;
      break;
    case -1:
      parser_local._4_4_ = XML_ERROR_UNCLOSED_TOKEN;
    }
  }
  else {
    if (local_3c == 0xe) {
      XVar1 = accountingDiffTolerated
                        ((XML_Parser)s_local,0xe,end_local,pcStack_38,0x1217,XML_ACCOUNT_DIRECT);
      if (XVar1 == '\0') {
        accountingOnAbort((XML_Parser)s_local);
        return XML_ERROR_AMPLIFICATION_LIMIT_BREACH;
      }
      end_local = pcStack_38;
      local_3c = (*(code *)**(undefined8 **)(s_local + 0x130))
                           (*(undefined8 *)(s_local + 0x130),pcStack_38,nextPtr_local,
                            &stack0xffffffffffffffc8);
    }
LAB_001bd159:
    *(code **)(s_local + 0x220) = prologProcessor;
    parser_local._4_4_ =
         doProlog((XML_Parser)s_local,*(ENCODING **)(s_local + 0x130),end_local,
                  (char *)nextPtr_local,local_3c,pcStack_38,(char **)next,
                  (s_local[0x39c] != '\0' ^ 0xffU) & 1,'\x01',XML_ACCOUNT_DIRECT);
  }
  return parser_local._4_4_;
}

Assistant:

static enum XML_Error PTRCALL
externalParEntProcessor(XML_Parser parser, const char *s, const char *end,
                        const char **nextPtr) {
  const char *next = s;
  int tok;

  tok = XmlPrologTok(parser->m_encoding, s, end, &next);
  if (tok <= 0) {
    if (! parser->m_parsingStatus.finalBuffer && tok != XML_TOK_INVALID) {
      *nextPtr = s;
      return XML_ERROR_NONE;
    }
    switch (tok) {
    case XML_TOK_INVALID:
      return XML_ERROR_INVALID_TOKEN;
    case XML_TOK_PARTIAL:
      return XML_ERROR_UNCLOSED_TOKEN;
    case XML_TOK_PARTIAL_CHAR:
      return XML_ERROR_PARTIAL_CHAR;
    case XML_TOK_NONE: /* start == end */
    default:
      break;
    }
  }
  /* This would cause the next stage, i.e. doProlog to be passed XML_TOK_BOM.
     However, when parsing an external subset, doProlog will not accept a BOM
     as valid, and report a syntax error, so we have to skip the BOM, and
     account for the BOM bytes.
  */
  else if (tok == XML_TOK_BOM) {
    if (! accountingDiffTolerated(parser, tok, s, next, __LINE__,
                                  XML_ACCOUNT_DIRECT)) {
      accountingOnAbort(parser);
      return XML_ERROR_AMPLIFICATION_LIMIT_BREACH;
    }

    s = next;
    tok = XmlPrologTok(parser->m_encoding, s, end, &next);
  }

  parser->m_processor = prologProcessor;
  return doProlog(parser, parser->m_encoding, s, end, tok, next, nextPtr,
                  (XML_Bool)! parser->m_parsingStatus.finalBuffer, XML_TRUE,
                  XML_ACCOUNT_DIRECT);
}